

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

void duckdb::WriteData<duckdb::uhugeint_t,duckdb_uhugeint,duckdb::CUhugeintConverter>
               (duckdb_column *column,ColumnDataCollection *source,
               vector<unsigned_long,_true> *column_ids)

{
  undefined8 *puVar1;
  void *pvVar2;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  bool bVar5;
  DataChunk *this;
  reference pvVar6;
  long lVar7;
  idx_t k;
  ulong row_idx;
  long lVar8;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterationHelper local_1a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  pvVar2 = column->deprecated_data;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::Chunks(&local_1a8,source,(vector<unsigned_long,_true> *)&local_188);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_188);
  ColumnDataChunkIterationHelper::begin(&local_170,&local_1a8);
  ColumnDataChunkIterationHelper::end(&local_d0,&local_1a8);
  lVar8 = 0;
  while( true ) {
    bVar5 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                      (&local_170,&local_d0);
    if (!bVar5) break;
    this = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_170);
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this->data,0);
    pdVar3 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this->data,0);
    FlatVector::VerifyFlatVector(pvVar6);
    lVar7 = 0;
    for (row_idx = 0; row_idx < this->count; row_idx = row_idx + 1) {
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(pvVar6->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar5) {
        uVar4 = *(undefined8 *)(pdVar3 + lVar7 + 8);
        puVar1 = (undefined8 *)((long)pvVar2 + lVar7 + lVar8 * 0x10);
        *puVar1 = *(undefined8 *)(pdVar3 + lVar7);
        puVar1[1] = uVar4;
      }
      lVar7 = lVar7 + 0x10;
    }
    lVar8 = lVar8 + row_idx;
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_170);
  }
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_d0);
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_170);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8.column_ids);
  return;
}

Assistant:

void WriteData(duckdb_column *column, ColumnDataCollection &source, const vector<column_t> &column_ids) {
	idx_t row = 0;
	auto target = (DST *)column->deprecated_data;
	for (auto &input : source.Chunks(column_ids)) {
		auto source = FlatVector::GetData<SRC>(input.data[0]);
		auto &mask = FlatVector::Validity(input.data[0]);

		for (idx_t k = 0; k < input.size(); k++, row++) {
			if (!mask.RowIsValid(k)) {
				OP::template NullConvert<DST>(target[row]);
			} else {
				target[row] = OP::template Convert<SRC, DST>(source[k]);
			}
		}
	}
}